

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O1

void brotli::RecomputeDistancePrefixes
               (Command *cmds,size_t num_commands,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  uint16_t *puVar4;
  ulong uVar5;
  uint32_t uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (num_commands != 0 && (distance_postfix_bits != 0 || num_direct_distance_codes != 0)) {
    uVar5 = (ulong)num_direct_distance_codes + 0x10;
    bVar2 = (byte)distance_postfix_bits;
    puVar4 = &cmds->dist_prefix_;
    do {
      if ((*(uint32_t *)(puVar4 + -9) != 0) && (0x7f < puVar4[-1])) {
        uVar1 = *puVar4;
        uVar3 = (uint)uVar1;
        if (0xf < uVar1) {
          uVar3 = *(uint *)(puVar4 + -3);
          uVar3 = ((uint)uVar1 + (uVar3 >> 0x18) * -2 + -0xc << ((byte)(uVar3 >> 0x18) & 0x1f)) +
                  (uVar3 & 0xffffff) + 0xc;
        }
        if (uVar3 < uVar5) {
          *puVar4 = (ushort)uVar3;
          uVar6 = 0;
        }
        else {
          uVar7 = (uVar3 - uVar5) + (long)(1 << (bVar2 + 2 & 0x1f));
          uVar3 = 0x1f;
          if ((uint)uVar7 != 0) {
            for (; (uint)uVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar3 = (uVar3 ^ 0xffffffe0) + 0x1f;
          bVar8 = (uVar7 >> ((ulong)uVar3 & 0x3f) & 1) != 0;
          *puVar4 = (short)((uint)bVar8 + (uVar3 - distance_postfix_bits) * 2 + 0xfffe <<
                           (bVar2 & 0x3f)) + (short)uVar5 +
                    ((ushort)uVar7 & ~(ushort)(-1 << (bVar2 & 0x1f)));
          uVar6 = (uint)(uVar7 - ((ulong)bVar8 + 2 << ((byte)uVar3 & 0x3f)) >> (bVar2 & 0x3f)) |
                  (uVar3 - distance_postfix_bits) * 0x1000000;
        }
        *(uint32_t *)(puVar4 + -3) = uVar6;
      }
      puVar4 = puVar4 + 0xc;
      num_commands = num_commands - 1;
    } while (num_commands != 0);
  }
  return;
}

Assistant:

void RecomputeDistancePrefixes(Command* cmds,
                               size_t num_commands,
                               uint32_t num_direct_distance_codes,
                               uint32_t distance_postfix_bits) {
  if (num_direct_distance_codes == 0 && distance_postfix_bits == 0) {
    return;
  }
  for (size_t i = 0; i < num_commands; ++i) {
    Command* cmd = &cmds[i];
    if (cmd->copy_len_ > 0 && cmd->cmd_prefix_ >= 128) {
      PrefixEncodeCopyDistance(cmd->DistanceCode(),
                               num_direct_distance_codes,
                               distance_postfix_bits,
                               &cmd->dist_prefix_,
                               &cmd->dist_extra_);
    }
  }
}